

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O0

unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> __thiscall
webrtc::AudioConverter::Create
          (AudioConverter *this,size_t src_channels,size_t src_frames,size_t dst_channels,
          size_t dst_frames)

{
  pointer pAVar1;
  ResampleConverter *pRVar2;
  CompositionConverter *pCVar3;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_d0;
  unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> local_b8;
  unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> local_b0;
  undefined1 local_a8 [8];
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  converters_1;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_88;
  unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> local_70 [3];
  unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> local_58;
  undefined1 local_50 [8];
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  converters;
  size_t dst_frames_local;
  size_t dst_channels_local;
  size_t src_frames_local;
  size_t src_channels_local;
  unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *sp;
  
  converters.
  super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>::
  unique_ptr<std::default_delete<webrtc::AudioConverter>,void>
            ((unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>> *)this)
  ;
  if (dst_channels < src_channels) {
    if (src_frames == dst_frames) {
      pAVar1 = (pointer)operator_new(0x28);
      DownmixConverter::DownmixConverter
                ((DownmixConverter *)pAVar1,src_channels,src_frames,dst_channels,dst_frames);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
                ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )this,pAVar1);
    }
    else {
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::vector((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                *)local_50);
      pAVar1 = (pointer)operator_new(0x28);
      DownmixConverter::DownmixConverter
                ((DownmixConverter *)pAVar1,src_channels,src_frames,dst_channels,src_frames);
      std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>::
      unique_ptr<std::default_delete<webrtc::AudioConverter>,void>
                ((unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>> *)
                 &local_58,pAVar1);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::push_back((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                   *)local_50,(value_type *)&local_58);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
      ~unique_ptr(&local_58);
      pRVar2 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar2,dst_channels,src_frames,dst_channels,dst_frames);
      std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>::
      unique_ptr<std::default_delete<webrtc::AudioConverter>,void>
                ((unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>> *)
                 local_70,(pointer)pRVar2);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::push_back((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                   *)local_50,(value_type *)local_70);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
      ~unique_ptr(local_70);
      pCVar3 = (CompositionConverter *)operator_new(0x58);
      converters_1.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::vector(&local_88,
               (vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                *)local_50);
      CompositionConverter::CompositionConverter(pCVar3,&local_88);
      converters_1.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
                ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )this,(pointer)pCVar3);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(&local_88);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                 *)local_50);
    }
  }
  else if (src_channels < dst_channels) {
    if (src_frames == dst_frames) {
      pAVar1 = (pointer)operator_new(0x28);
      UpmixConverter::UpmixConverter
                ((UpmixConverter *)pAVar1,src_channels,src_frames,dst_channels,dst_frames);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
                ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )this,pAVar1);
    }
    else {
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::vector((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                *)local_a8);
      pRVar2 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar2,src_channels,src_frames,src_channels,dst_frames);
      std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>::
      unique_ptr<std::default_delete<webrtc::AudioConverter>,void>
                ((unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>> *)
                 &local_b0,(pointer)pRVar2);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::push_back((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                   *)local_a8,(value_type *)&local_b0);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
      ~unique_ptr(&local_b0);
      pAVar1 = (pointer)operator_new(0x28);
      UpmixConverter::UpmixConverter
                ((UpmixConverter *)pAVar1,src_channels,dst_frames,dst_channels,dst_frames);
      std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>::
      unique_ptr<std::default_delete<webrtc::AudioConverter>,void>
                ((unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>> *)
                 &local_b8,pAVar1);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::push_back((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                   *)local_a8,(value_type *)&local_b8);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
      ~unique_ptr(&local_b8);
      pCVar3 = (CompositionConverter *)operator_new(0x58);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::vector(&local_d0,
               (vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                *)local_a8);
      CompositionConverter::CompositionConverter(pCVar3,&local_d0);
      std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
                ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )this,(pointer)pCVar3);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(&local_d0);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector((vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                 *)local_a8);
    }
  }
  else if (src_frames == dst_frames) {
    pAVar1 = (pointer)operator_new(0x28);
    CopyConverter::CopyConverter
              ((CopyConverter *)pAVar1,src_channels,src_frames,dst_channels,dst_frames);
    std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
              ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *)
               this,pAVar1);
  }
  else {
    pRVar2 = (ResampleConverter *)operator_new(0x40);
    ResampleConverter::ResampleConverter(pRVar2,src_channels,src_frames,dst_channels,dst_frames);
    std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::reset
              ((unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *)
               this,(pointer)pRVar2);
  }
  return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
          )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AudioConverter> AudioConverter::Create(size_t src_channels,
                                                       size_t src_frames,
                                                       size_t dst_channels,
                                                       size_t dst_frames) {
  std::unique_ptr<AudioConverter> sp;
  if (src_channels > dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(std::unique_ptr<AudioConverter>(new DownmixConverter(
          src_channels, src_frames, dst_channels, src_frames)));
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              dst_channels, src_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new DownmixConverter(src_channels, src_frames, dst_channels,
                                    dst_frames));
    }
  } else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              src_channels, src_frames, src_channels, dst_frames)));
      converters.push_back(std::unique_ptr<AudioConverter>(new UpmixConverter(
          src_channels, dst_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new UpmixConverter(src_channels, src_frames, dst_channels,
                                  dst_frames));
    }
  } else if (src_frames != dst_frames) {
    sp.reset(new ResampleConverter(src_channels, src_frames, dst_channels,
                                   dst_frames));
  } else {
    sp.reset(new CopyConverter(src_channels, src_frames, dst_channels,
                               dst_frames));
  }

  return sp;
}